

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_console.hpp
# Opt level: O3

void iutest::detail::iuConsole::color_output(Color color,char *fmt,...)

{
  char in_AL;
  int iVar1;
  TestFlag *pTVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list va;
  undefined8 local_e8;
  void **local_e0;
  undefined1 *local_d8;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  local_d8 = local_c8;
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_e0 = &va[0].overflow_arg_area;
  local_e8 = 0x3000000010;
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  pTVar2 = TestFlag::GetInstance();
  if ((pTVar2->m_test_flags & 0x100) == 0) {
    pTVar2 = TestFlag::GetInstance();
    if ((pTVar2->m_test_flags & 0x200) == 0) {
      if (IsShouldUseColor(bool)::has_color == '\0') {
        iVar1 = __cxa_guard_acquire(&IsShouldUseColor(bool)::has_color);
        if (iVar1 != 0) {
          IsShouldUseColor(bool)::has_color = HasColorConsole();
          __cxa_guard_release(&IsShouldUseColor(bool)::has_color);
        }
      }
      if ((IsShouldUseColor(bool)::has_color & 1) != 0) goto LAB_00116ffb;
    }
    if (GetLoggerInstanceVariable()::sLogger == (long *)0x0) {
      vprintf(fmt,&local_e8);
    }
    else {
      (**(code **)(*GetLoggerInstanceVariable()::sLogger + 0x18))
                (GetLoggerInstanceVariable()::sLogger,fmt,&local_e8);
    }
  }
  else {
LAB_00116ffb:
    output("\x1b[1;3%cm",(ulong)(color + 0x30));
    if (GetLoggerInstanceVariable()::sLogger == (long *)0x0) {
      vprintf(fmt,&local_e8);
    }
    else {
      (**(code **)(*GetLoggerInstanceVariable()::sLogger + 0x18))
                (GetLoggerInstanceVariable()::sLogger,fmt,&local_e8);
    }
    output("\x1b[m");
  }
  return;
}

Assistant:

inline void iuConsole::color_output(Color color, const char *fmt, ...)
{
    va_list va;
    va_start(va, fmt);

    if( IsShouldUseColor(true) )
    {
        color_output_impl(color, fmt, va);
    }
    else
    {
        voutput(fmt, va);
    }

    va_end(va);
}